

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeField(ParserImpl *this,Message *message)

{
  string_view sVar1;
  string_view sVar2;
  string_view sVar3;
  undefined8 uVar4;
  bool bVar5;
  CppType CVar6;
  int iVar7;
  Reflection *this_00;
  Token *pTVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Descriptor *this_01;
  LogMessage *pLVar9;
  FieldOptions *pFVar10;
  undefined4 extraout_var_02;
  MessageLite *this_02;
  ulong uVar11;
  AlphaNum *b;
  AlphaNum *in_R8;
  undefined1 auVar12 [16];
  string_view sVar13;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  undefined5 in_stack_ffffffffffffef88;
  undefined1 in_stack_ffffffffffffef8d;
  undefined1 in_stack_ffffffffffffef8e;
  undefined1 in_stack_ffffffffffffef8f;
  bool local_1023;
  MessageFactory *local_1008;
  byte local_f6a;
  byte local_f49;
  FieldDescriptor *local_eb0;
  FieldDescriptor *local_e70;
  Descriptor *local_de8;
  bool local_d91;
  allocator<char> local_d79;
  string local_d78;
  allocator<char> local_d51;
  string local_d50;
  allocator<char> local_d29;
  string local_d28;
  byte local_d03;
  byte local_d02;
  allocator<char> local_d01;
  string local_d00;
  allocator<char> local_cd9;
  string local_cd8;
  string_view local_cb8;
  MessageFactory *local_ca8;
  MessageFactory *factory;
  string tmp;
  string local_c78;
  byte local_c51;
  undefined1 auStack_c50 [7];
  bool consumed_semicolon;
  char *local_c48;
  AlphaNum local_c40;
  string_view local_c10;
  AlphaNum local_c00;
  AlphaNum local_bd0;
  AlphaNum local_ba0;
  AlphaNum local_b70;
  string local_b40;
  string_view local_b20;
  FieldDescriptor *local_b10;
  FieldDescriptor *other_field;
  OneofDescriptor *oneof;
  AlphaNum local_ad0;
  AlphaNum local_aa0;
  string local_a70;
  string_view local_a50;
  AlphaNum local_a40;
  AlphaNum local_a10;
  AlphaNum local_9e0;
  string local_9b0;
  string_view local_990;
  byte local_97b;
  byte local_97a;
  allocator<char> local_979;
  string local_978;
  allocator<char> local_951;
  string local_950;
  allocator<char> local_929;
  string local_928;
  byte local_901;
  LogMessage local_900;
  Voidify local_8e9;
  AlphaNum local_8e8;
  AlphaNum local_8b8;
  AlphaNum local_888;
  string_view local_858;
  AlphaNum local_848;
  AlphaNum local_818;
  string local_7e8;
  string_view local_7c8;
  AlphaNum local_7b8;
  AlphaNum local_788;
  AlphaNum local_758;
  string_view local_728;
  AlphaNum local_718;
  AlphaNum local_6e8;
  string local_6b8;
  string_view local_698;
  string_view local_688;
  string_view local_678;
  undefined1 local_668 [8];
  string lower_field_name_1;
  undefined1 local_618 [8];
  string lower_field_name;
  uint local_5d4;
  undefined1 local_5d0 [4];
  int32_t field_number;
  string_view local_5a0;
  AlphaNum local_590;
  AlphaNum local_560;
  AlphaNum local_530;
  AlphaNum local_500;
  string local_4d0;
  string_view local_4b0;
  AlphaNum local_4a0;
  string_view local_470;
  AlphaNum local_460;
  AlphaNum local_430;
  AlphaNum local_400;
  AlphaNum local_3d0;
  string local_3a0;
  string_view local_380;
  allocator<char> local_369;
  string local_368;
  allocator<char> local_341;
  string local_340;
  string local_320;
  string local_300;
  string_view local_2e0;
  AlphaNum local_2d0;
  AlphaNum local_2a0;
  AlphaNum local_270;
  string local_240;
  string_view local_220;
  Descriptor *local_210;
  Descriptor *value_descriptor;
  string serialized_value;
  string local_1e0;
  allocator<char> local_1b9;
  string local_1b8;
  AlphaNum local_198;
  AlphaNum local_168;
  undefined1 local_138 [8];
  string prefix_and_full_type_name;
  undefined1 local_110 [8];
  string prefix;
  string full_type_name;
  string local_c8;
  FieldDescriptor *local_98;
  FieldDescriptor *any_value_field;
  FieldDescriptor *any_type_url_field;
  anon_class_32_4_2c58ab61 skip_parsing;
  int start_column;
  int start_line;
  FieldDescriptor *field;
  undefined1 local_50 [7];
  bool reserved_field;
  string field_name;
  Descriptor *descriptor;
  Reflection *reflection;
  Message *message_local;
  ParserImpl *this_local;
  
  this_00 = Message::GetReflection(message);
  field_name.field_2._8_8_ = Message::GetDescriptor(message);
  std::__cxx11::string::string((string *)local_50);
  field._7_1_ = 0;
  _start_column = (FieldDescriptor *)0x0;
  pTVar8 = protobuf::io::Tokenizer::current(&this->tokenizer_);
  skip_parsing.start_column._4_4_ = pTVar8->line;
  pTVar8 = protobuf::io::Tokenizer::current(&this->tokenizer_);
  skip_parsing.start_column._0_4_ = pTVar8->column;
  uVar11 = (ulong)(uint)skip_parsing.start_column;
  skip_parsing.this = (ParserImpl *)&start_column;
  skip_parsing.field = (FieldDescriptor **)((long)&skip_parsing.start_column + 4);
  skip_parsing.start_line = (int *)&skip_parsing.start_column;
  full_type_name.field_2._M_local_buf[0xe] = '\0';
  full_type_name.field_2._M_local_buf[0xd] = '\0';
  any_type_url_field = (FieldDescriptor *)this;
  bVar5 = internal::GetAnyFieldDescriptors(message,&any_value_field,&local_98);
  b = (AlphaNum *)CONCAT71((int7)(uVar11 >> 8),bVar5);
  local_d91 = false;
  if (bVar5) {
    std::allocator<char>::allocator();
    full_type_name.field_2._M_local_buf[0xe] = '\x01';
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"[",
               (allocator<char> *)(full_type_name.field_2._M_local_buf + 0xf));
    full_type_name.field_2._M_local_buf[0xd] = '\x01';
    local_d91 = TryConsume(this,&local_c8);
  }
  if ((full_type_name.field_2._M_local_buf[0xd] & 1U) != 0) {
    std::__cxx11::string::~string((string *)&local_c8);
  }
  if ((full_type_name.field_2._M_local_buf[0xe] & 1U) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)(full_type_name.field_2._M_local_buf + 0xf))
    ;
  }
  if (local_d91 != false) {
    std::__cxx11::string::string((string *)(prefix.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)local_110);
    bVar5 = ConsumeAnyTypeUrl(this,(string *)(prefix.field_2._M_local_buf + 8),(string *)local_110);
    if (bVar5) {
      absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
                (&local_168,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110);
      absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
                (&local_198,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&prefix.field_2 + 8));
      absl::lts_20250127::StrCat_abi_cxx11_
                ((string *)local_138,(lts_20250127 *)&local_168,&local_198,b);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b8,"]",&local_1b9);
      bVar5 = ConsumeBeforeWhitespace(this,&local_1b8);
      std::__cxx11::string::~string((string *)&local_1b8);
      std::allocator<char>::~allocator(&local_1b9);
      if (bVar5) {
        TryConsumeWhitespace(this);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1e0,":",
                   (allocator<char> *)(serialized_value.field_2._M_local_buf + 0xf));
        bVar5 = TryConsumeBeforeWhitespace(this,&local_1e0);
        std::__cxx11::string::~string((string *)&local_1e0);
        std::allocator<char>::~allocator
                  ((allocator<char> *)(serialized_value.field_2._M_local_buf + 0xf));
        if (bVar5) {
          TryConsumeWhitespace(this);
        }
        std::__cxx11::string::string((string *)&value_descriptor);
        if (this->finder_ == (Finder *)0x0) {
          local_de8 = anon_unknown_14::DefaultFinderFindAnyType
                                (message,(string *)local_110,(string *)((long)&prefix.field_2 + 8));
        }
        else {
          iVar7 = (*this->finder_->_vptr_Finder[4])
                            (this->finder_,message,local_110,
                             (undefined1 *)((long)&prefix.field_2 + 8));
          local_de8 = (Descriptor *)CONCAT44(extraout_var,iVar7);
        }
        local_210 = local_de8;
        if (local_de8 == (Descriptor *)0x0) {
          absl::lts_20250127::AlphaNum::AlphaNum(&local_270,"Could not find type \"");
          absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
                    (&local_2a0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138)
          ;
          absl::lts_20250127::AlphaNum::AlphaNum(&local_2d0,"\" stored in google.protobuf.Any.");
          absl::lts_20250127::StrCat_abi_cxx11_
                    (&local_240,(lts_20250127 *)&local_270,&local_2a0,&local_2d0,in_R8);
          local_220 = (string_view)
                      std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_240)
          ;
          ReportError(this,local_220);
          std::__cxx11::string::~string((string *)&local_240);
          this_local._7_1_ = false;
        }
        else {
          bVar5 = ConsumeAnyValue(this,local_de8,(string *)&value_descriptor);
          if (bVar5) {
            if ((this->singular_overwrite_policy_ != FORBID_SINGULAR_OVERWRITES) ||
               (((bVar5 = FieldDescriptor::is_repeated(any_value_field), bVar5 ||
                 (bVar5 = Reflection::HasField(this_00,message,any_value_field), !bVar5)) &&
                ((bVar5 = FieldDescriptor::is_repeated(local_98), bVar5 ||
                 (bVar5 = Reflection::HasField(this_00,message,local_98), !bVar5)))))) {
              std::__cxx11::string::string((string *)&local_300,(string *)local_138);
              Reflection::SetString(this_00,message,any_value_field,&local_300);
              std::__cxx11::string::~string((string *)&local_300);
              std::__cxx11::string::string((string *)&local_320,(string *)&value_descriptor);
              Reflection::SetString(this_00,message,local_98,&local_320);
              std::__cxx11::string::~string((string *)&local_320);
              this_local._7_1_ =
                   ConsumeField::anon_class_32_4_2c58ab61::operator()
                             ((anon_class_32_4_2c58ab61 *)&any_type_url_field,true);
            }
            else {
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        (&local_2e0,"Non-repeated Any specified multiple times.");
              ReportError(this,local_2e0);
              this_local._7_1_ = false;
            }
          }
          else {
            this_local._7_1_ = false;
          }
        }
        prefix_and_full_type_name.field_2._12_4_ = 1;
        std::__cxx11::string::~string((string *)&value_descriptor);
      }
      else {
        this_local._7_1_ = false;
        prefix_and_full_type_name.field_2._12_4_ = 1;
      }
      std::__cxx11::string::~string((string *)local_138);
    }
    else {
      this_local._7_1_ = false;
      prefix_and_full_type_name.field_2._12_4_ = 1;
    }
    std::__cxx11::string::~string((string *)local_110);
    std::__cxx11::string::~string((string *)(prefix.field_2._M_local_buf + 8));
    goto LAB_01b3409c;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_340,"[",&local_341);
  bVar5 = TryConsume(this,&local_340);
  std::__cxx11::string::~string((string *)&local_340);
  std::allocator<char>::~allocator(&local_341);
  if (bVar5) {
    bVar5 = ConsumeFullTypeName(this,(string *)local_50);
    if (!bVar5) {
      this_local._7_1_ = false;
      prefix_and_full_type_name.field_2._12_4_ = 1;
      goto LAB_01b3409c;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_368,"]",&local_369);
    bVar5 = ConsumeBeforeWhitespace(this,&local_368);
    std::__cxx11::string::~string((string *)&local_368);
    std::allocator<char>::~allocator(&local_369);
    if (!bVar5) {
      this_local._7_1_ = false;
      prefix_and_full_type_name.field_2._12_4_ = 1;
      goto LAB_01b3409c;
    }
    TryConsumeWhitespace(this);
    if (this->finder_ == (Finder *)0x0) {
      local_e70 = anon_unknown_14::DefaultFinderFindExtension(message,(string *)local_50);
    }
    else {
      iVar7 = (*this->finder_->_vptr_Finder[2])(this->finder_,message,local_50);
      local_e70 = (FieldDescriptor *)CONCAT44(extraout_var_00,iVar7);
    }
    _start_column = local_e70;
    if (local_e70 == (FieldDescriptor *)0x0) {
      if (((this->allow_unknown_field_ & 1U) == 0) && ((this->allow_unknown_extension_ & 1U) == 0))
      {
        absl::lts_20250127::AlphaNum::AlphaNum(&local_3d0,"Extension \"");
        absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
                  (&local_400,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
        absl::lts_20250127::AlphaNum::AlphaNum
                  (&local_430,"\" is not defined or is not an extension of \"");
        local_470 = Descriptor::full_name((Descriptor *)field_name.field_2._8_8_);
        absl::lts_20250127::AlphaNum::AlphaNum(&local_460,local_470);
        absl::lts_20250127::AlphaNum::AlphaNum(&local_4a0,"\".");
        absl::lts_20250127::StrCat<>
                  (&local_3a0,&local_3d0,&local_400,&local_430,&local_460,&local_4a0);
        local_380 = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_3a0);
        ReportError(this,local_380);
        std::__cxx11::string::~string((string *)&local_3a0);
        this_local._7_1_ = false;
        prefix_and_full_type_name.field_2._12_4_ = 1;
        goto LAB_01b3409c;
      }
      absl::lts_20250127::AlphaNum::AlphaNum(&local_500,"Ignoring extension \"");
      absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
                (&local_530,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
      absl::lts_20250127::AlphaNum::AlphaNum
                (&local_560,"\" which is not defined or is not an extension of \"");
      local_5a0 = Descriptor::full_name((Descriptor *)field_name.field_2._8_8_);
      absl::lts_20250127::AlphaNum::AlphaNum(&local_590,local_5a0);
      absl::lts_20250127::AlphaNum::AlphaNum((AlphaNum *)local_5d0,"\".");
      in_R8 = &local_590;
      absl::lts_20250127::StrCat<>
                (&local_4d0,&local_500,&local_530,&local_560,in_R8,(AlphaNum *)local_5d0);
      local_4b0 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_4d0);
      ReportWarning(this,local_4b0);
      std::__cxx11::string::~string((string *)&local_4d0);
    }
  }
  else {
    bVar5 = ConsumeIdentifierBeforeWhitespace(this,(string *)local_50);
    if (!bVar5) {
      this_local._7_1_ = false;
      prefix_and_full_type_name.field_2._12_4_ = 1;
      goto LAB_01b3409c;
    }
    TryConsumeWhitespace(this);
    if ((this->allow_field_number_ & 1U) == 0) {
LAB_01b32a0e:
      uVar4 = field_name.field_2._8_8_;
      sVar13 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_50);
      lower_field_name.field_2._8_8_ = sVar13._M_len;
      _start_column = Descriptor::FindFieldByName((Descriptor *)uVar4,sVar13);
      if (_start_column == (FieldDescriptor *)0x0) {
        std::__cxx11::string::string((string *)local_618,(string *)local_50);
        absl::lts_20250127::AsciiStrToLower((Nonnull<std::string_*>)local_618);
        uVar4 = field_name.field_2._8_8_;
        sVar13 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_618);
        _start_column = Descriptor::FindFieldByName((Descriptor *)uVar4,sVar13);
        if ((_start_column != (FieldDescriptor *)0x0) &&
           (bVar5 = internal::cpp::IsGroupLike(_start_column), !bVar5)) {
          _start_column = (FieldDescriptor *)0x0;
        }
        if (_start_column != (FieldDescriptor *)0x0) {
          this_01 = FieldDescriptor::message_type(_start_column);
          sVar13 = Descriptor::name(this_01);
          __y = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_50);
          lower_field_name_1.field_2._8_8_ = __y._M_len;
          bVar5 = std::operator!=(sVar13,__y);
          if (bVar5) {
            _start_column = (FieldDescriptor *)0x0;
          }
        }
        std::__cxx11::string::~string((string *)local_618);
      }
      sVar2._M_str = local_678._M_str;
      sVar2._M_len = local_678._M_len;
      if ((_start_column == (FieldDescriptor *)0x0) &&
         (local_678 = sVar2, (this->allow_case_insensitive_field_ & 1U) != 0)) {
        std::__cxx11::string::string((string *)local_668,(string *)local_50);
        absl::lts_20250127::AsciiStrToLower((Nonnull<std::string_*>)local_668);
        uVar4 = field_name.field_2._8_8_;
        local_678 = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_668);
        _start_column = Descriptor::FindFieldByLowercaseName((Descriptor *)uVar4,local_678);
        std::__cxx11::string::~string((string *)local_668);
      }
      uVar4 = field_name.field_2._8_8_;
      if (_start_column == (FieldDescriptor *)0x0) {
        local_688 = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_50);
        field._7_1_ = Descriptor::IsReservedName((Descriptor *)uVar4,local_688);
      }
    }
    else {
      auVar12 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_50);
      sVar13._M_str = (char *)&local_5d4;
      sVar13._M_len = auVar12._8_8_;
      bVar5 = absl::lts_20250127::SimpleAtoi<int>(auVar12._0_8_,sVar13,(Nonnull<int_*>)b);
      if (!bVar5) goto LAB_01b32a0e;
      bVar5 = Descriptor::IsExtensionNumber((Descriptor *)field_name.field_2._8_8_,local_5d4);
      if (bVar5) {
        if (this->finder_ == (Finder *)0x0) {
          local_eb0 = anon_unknown_14::DefaultFinderFindExtensionByNumber
                                ((Descriptor *)field_name.field_2._8_8_,local_5d4);
        }
        else {
          iVar7 = (*this->finder_->_vptr_Finder[3])
                            (this->finder_,field_name.field_2._8_8_,(ulong)local_5d4);
          local_eb0 = (FieldDescriptor *)CONCAT44(extraout_var_01,iVar7);
        }
        _start_column = local_eb0;
      }
      else {
        bVar5 = Descriptor::IsReservedNumber((Descriptor *)field_name.field_2._8_8_,local_5d4);
        if (bVar5) {
          field._7_1_ = 1;
        }
        else {
          _start_column =
               Descriptor::FindFieldByNumber((Descriptor *)field_name.field_2._8_8_,local_5d4);
        }
      }
    }
    sVar3._M_str = local_7c8._M_str;
    sVar3._M_len = local_7c8._M_len;
    sVar1._M_str = local_858._M_str;
    sVar1._M_len = local_858._M_len;
    if ((_start_column == (FieldDescriptor *)0x0) &&
       (local_858 = sVar1, local_7c8 = sVar3, (field._7_1_ & 1) == 0)) {
      if ((this->allow_unknown_field_ & 1U) == 0) {
        absl::lts_20250127::AlphaNum::AlphaNum(&local_6e8,"Message type \"");
        local_728 = Descriptor::full_name((Descriptor *)field_name.field_2._8_8_);
        absl::lts_20250127::AlphaNum::AlphaNum(&local_718,local_728);
        absl::lts_20250127::AlphaNum::AlphaNum(&local_758,"\" has no field named \"");
        absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
                  (&local_788,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
        absl::lts_20250127::AlphaNum::AlphaNum(&local_7b8,"\".");
        absl::lts_20250127::StrCat<>
                  (&local_6b8,&local_6e8,&local_718,&local_758,&local_788,&local_7b8);
        local_698 = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_6b8);
        ReportError(this,local_698);
        std::__cxx11::string::~string((string *)&local_6b8);
        this_local._7_1_ = false;
        prefix_and_full_type_name.field_2._12_4_ = 1;
        goto LAB_01b3409c;
      }
      absl::lts_20250127::AlphaNum::AlphaNum(&local_818,"Message type \"");
      local_858 = Descriptor::full_name((Descriptor *)field_name.field_2._8_8_);
      absl::lts_20250127::AlphaNum::AlphaNum(&local_848,local_858);
      absl::lts_20250127::AlphaNum::AlphaNum(&local_888,"\" has no field named \"");
      absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
                (&local_8b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
      absl::lts_20250127::AlphaNum::AlphaNum(&local_8e8,"\".");
      in_R8 = &local_8b8;
      absl::lts_20250127::StrCat<>(&local_7e8,&local_818,&local_848,&local_888,in_R8,&local_8e8);
      local_7c8 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_7e8);
      ReportWarning(this,local_7c8);
      std::__cxx11::string::~string((string *)&local_7e8);
    }
  }
  if (_start_column == (FieldDescriptor *)0x0) {
    local_901 = 0;
    local_f49 = 1;
    if (((this->allow_unknown_field_ & 1U) == 0) &&
       (local_f49 = 1, (this->allow_unknown_extension_ & 1U) == 0)) {
      local_f49 = field._7_1_;
    }
    if (((local_f49 ^ 0xff) & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_900,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/text_format.cc"
                 ,0x261,"allow_unknown_field_ || allow_unknown_extension_ || reserved_field");
      local_901 = 1;
      pLVar9 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_900);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_8e9,pLVar9);
    }
    if ((local_901 & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_900);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_928,":",&local_929);
    bVar5 = TryConsumeBeforeWhitespace(this,&local_928);
    std::__cxx11::string::~string((string *)&local_928);
    std::allocator<char>::~allocator(&local_929);
    if (bVar5) {
      TryConsumeWhitespace(this);
      std::allocator<char>::allocator();
      local_97a = 0;
      local_97b = 0;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_950,"{",&local_951);
      bVar5 = LookingAt(this,&local_950);
      local_f6a = 0;
      if (!bVar5) {
        std::allocator<char>::allocator();
        local_97a = 1;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_978,"<",&local_979);
        local_97b = 1;
        bVar5 = LookingAt(this,&local_978);
        local_f6a = bVar5 ^ 0xff;
      }
      if ((local_97b & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_978);
      }
      if ((local_97a & 1) != 0) {
        std::allocator<char>::~allocator(&local_979);
      }
      std::__cxx11::string::~string((string *)&local_950);
      std::allocator<char>::~allocator(&local_951);
      if ((local_f6a & 1) != 0) {
        bVar5 = SkipFieldValue(this);
        this_local._7_1_ =
             ConsumeField::anon_class_32_4_2c58ab61::operator()
                       ((anon_class_32_4_2c58ab61 *)&any_type_url_field,bVar5);
        prefix_and_full_type_name.field_2._12_4_ = 1;
        goto LAB_01b3409c;
      }
    }
    bVar5 = SkipFieldMessage(this);
    this_local._7_1_ =
         ConsumeField::anon_class_32_4_2c58ab61::operator()
                   ((anon_class_32_4_2c58ab61 *)&any_type_url_field,bVar5);
    prefix_and_full_type_name.field_2._12_4_ = 1;
  }
  else {
    pFVar10 = FieldDescriptor::options(_start_column);
    bVar5 = FieldOptions::deprecated(pFVar10);
    if (bVar5) {
      absl::lts_20250127::AlphaNum::AlphaNum(&local_9e0,"text format contains deprecated field \"");
      absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
                (&local_a10,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
      absl::lts_20250127::AlphaNum::AlphaNum(&local_a40,"\"");
      absl::lts_20250127::StrCat_abi_cxx11_
                (&local_9b0,(lts_20250127 *)&local_9e0,&local_a10,&local_a40,in_R8);
      local_990 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_9b0);
      ReportWarning(this,local_990);
      std::__cxx11::string::~string((string *)&local_9b0);
    }
    if (this->singular_overwrite_policy_ == FORBID_SINGULAR_OVERWRITES) {
      bVar5 = FieldDescriptor::is_repeated(_start_column);
      if (!bVar5) {
        bVar5 = Reflection::HasField(this_00,message,_start_column);
        if (bVar5) {
          absl::lts_20250127::AlphaNum::AlphaNum(&local_aa0,"Non-repeated field \"");
          absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
                    (&local_ad0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
          absl::lts_20250127::AlphaNum::AlphaNum
                    ((AlphaNum *)&oneof,"\" is specified multiple times.");
          absl::lts_20250127::StrCat_abi_cxx11_
                    (&local_a70,(lts_20250127 *)&local_aa0,&local_ad0,(AlphaNum *)&oneof,in_R8);
          local_a50 = (string_view)
                      std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_a70)
          ;
          ReportError(this,local_a50);
          std::__cxx11::string::~string((string *)&local_a70);
          this_local._7_1_ = false;
          prefix_and_full_type_name.field_2._12_4_ = 1;
          goto LAB_01b3409c;
        }
      }
      other_field = (FieldDescriptor *)FieldDescriptor::containing_oneof(_start_column);
      if (other_field != (FieldDescriptor *)0x0) {
        bVar5 = Reflection::HasOneof(this_00,message,(OneofDescriptor *)other_field);
        if (bVar5) {
          local_b10 = Reflection::GetOneofFieldDescriptor
                                (this_00,message,(OneofDescriptor *)other_field);
          absl::lts_20250127::AlphaNum::AlphaNum(&local_b70,"Field \"");
          absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
                    (&local_ba0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
          absl::lts_20250127::AlphaNum::AlphaNum(&local_bd0,"\" is specified along with field \"");
          local_c10 = FieldDescriptor::name(local_b10);
          absl::lts_20250127::AlphaNum::AlphaNum(&local_c00,local_c10);
          absl::lts_20250127::AlphaNum::AlphaNum(&local_c40,"\", another member of oneof \"");
          _auStack_c50 = OneofDescriptor::name((OneofDescriptor *)other_field);
          absl::lts_20250127::StrCat<std::basic_string_view<char,std::char_traits<char>>,char[3]>
                    (&local_b40,(lts_20250127 *)&local_b70,&local_ba0,&local_bd0,&local_c00,
                     &local_c40,(AlphaNum *)auStack_c50,
                     (basic_string_view<char,_std::char_traits<char>_> *)0x2073f9d,
                     (char (*) [3])
                     CONCAT17(in_stack_ffffffffffffef8f,
                              CONCAT16(in_stack_ffffffffffffef8e,
                                       CONCAT15(in_stack_ffffffffffffef8d,in_stack_ffffffffffffef88)
                                      )));
          local_b20 = (string_view)
                      std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_b40)
          ;
          ReportError(this,local_b20);
          std::__cxx11::string::~string((string *)&local_b40);
          this_local._7_1_ = false;
          prefix_and_full_type_name.field_2._12_4_ = 1;
          goto LAB_01b3409c;
        }
      }
    }
    CVar6 = FieldDescriptor::cpp_type(_start_column);
    if (CVar6 == CPPTYPE_MESSAGE) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c78,":",(allocator<char> *)(tmp.field_2._M_local_buf + 0xf));
      bVar5 = TryConsumeBeforeWhitespace(this,&local_c78);
      std::__cxx11::string::~string((string *)&local_c78);
      std::allocator<char>::~allocator((allocator<char> *)(tmp.field_2._M_local_buf + 0xf));
      local_c51 = bVar5;
      if (bVar5) {
        TryConsumeWhitespace(this);
      }
      if ((local_c51 & 1) != 0) {
        pFVar10 = FieldDescriptor::options(_start_column);
        bVar5 = FieldOptions::weak(pFVar10);
        if (bVar5) {
          bVar5 = LookingAtType(this,TYPE_STRING);
          if (bVar5) {
            std::__cxx11::string::string((string *)&factory);
            bVar5 = ConsumeString(this,(string *)&factory);
            if (bVar5) {
              if (this->finder_ == (Finder *)0x0) {
                local_1008 = (MessageFactory *)0x0;
              }
              else {
                iVar7 = (*this->finder_->_vptr_Finder[5])(this->finder_,_start_column);
                local_1008 = (MessageFactory *)CONCAT44(extraout_var_02,iVar7);
              }
              local_ca8 = local_1008;
              this_02 = &Reflection::MutableMessage(this_00,message,_start_column,local_1008)->
                         super_MessageLite;
              local_cb8 = (string_view)
                          std::__cxx11::string::operator_cast_to_basic_string_view
                                    ((string *)&factory);
              protobuf::MessageLite::ParseFromString(this_02,local_cb8);
              this_local._7_1_ =
                   ConsumeField::anon_class_32_4_2c58ab61::operator()
                             ((anon_class_32_4_2c58ab61 *)&any_type_url_field,true);
            }
            else {
              this_local._7_1_ = false;
            }
            prefix_and_full_type_name.field_2._12_4_ = 1;
            std::__cxx11::string::~string((string *)&factory);
            goto LAB_01b3409c;
          }
        }
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_cd8,":",&local_cd9);
      bVar5 = ConsumeBeforeWhitespace(this,&local_cd8);
      std::__cxx11::string::~string((string *)&local_cd8);
      std::allocator<char>::~allocator(&local_cd9);
      if (!bVar5) {
        this_local._7_1_ = false;
        prefix_and_full_type_name.field_2._12_4_ = 1;
        goto LAB_01b3409c;
      }
      TryConsumeWhitespace(this);
    }
    local_d02 = 0;
    local_d03 = 0;
    bVar5 = FieldDescriptor::is_repeated(_start_column);
    local_1023 = false;
    if (bVar5) {
      std::allocator<char>::allocator();
      local_d02 = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_d00,"[",&local_d01);
      local_d03 = 1;
      local_1023 = TryConsume(this,&local_d00);
    }
    if ((local_d03 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_d00);
    }
    if ((local_d02 & 1) != 0) {
      std::allocator<char>::~allocator(&local_d01);
    }
    if (local_1023 == false) {
      CVar6 = FieldDescriptor::cpp_type(_start_column);
      if (CVar6 == CPPTYPE_MESSAGE) {
        bVar5 = ConsumeFieldMessage(this,message,this_00,_start_column);
        if (!bVar5) {
          this_local._7_1_ = false;
          prefix_and_full_type_name.field_2._12_4_ = 1;
          goto LAB_01b3409c;
        }
      }
      else {
        bVar5 = ConsumeFieldValue(this,message,this_00,_start_column);
        if (!bVar5) {
          this_local._7_1_ = false;
          prefix_and_full_type_name.field_2._12_4_ = 1;
          goto LAB_01b3409c;
        }
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_d28,"]",&local_d29);
      bVar5 = TryConsume(this,&local_d28);
      std::__cxx11::string::~string((string *)&local_d28);
      std::allocator<char>::~allocator(&local_d29);
      if (((bVar5 ^ 0xffU) & 1) != 0) {
        do {
          CVar6 = FieldDescriptor::cpp_type(_start_column);
          if (CVar6 == CPPTYPE_MESSAGE) {
            bVar5 = ConsumeFieldMessage(this,message,this_00,_start_column);
            if (!bVar5) {
              this_local._7_1_ = false;
              prefix_and_full_type_name.field_2._12_4_ = 1;
              goto LAB_01b3409c;
            }
          }
          else {
            bVar5 = ConsumeFieldValue(this,message,this_00,_start_column);
            if (!bVar5) {
              this_local._7_1_ = false;
              prefix_and_full_type_name.field_2._12_4_ = 1;
              goto LAB_01b3409c;
            }
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_d50,"]",&local_d51);
          bVar5 = TryConsume(this,&local_d50);
          std::__cxx11::string::~string((string *)&local_d50);
          std::allocator<char>::~allocator(&local_d51);
          if (bVar5) goto LAB_01b34071;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_d78,",",&local_d79);
          bVar5 = Consume(this,&local_d78);
          std::__cxx11::string::~string((string *)&local_d78);
          std::allocator<char>::~allocator(&local_d79);
        } while (bVar5);
        this_local._7_1_ = false;
        prefix_and_full_type_name.field_2._12_4_ = 1;
        goto LAB_01b3409c;
      }
    }
LAB_01b34071:
    this_local._7_1_ =
         ConsumeField::anon_class_32_4_2c58ab61::operator()
                   ((anon_class_32_4_2c58ab61 *)&any_type_url_field,true);
    prefix_and_full_type_name.field_2._12_4_ = 1;
  }
LAB_01b3409c:
  std::__cxx11::string::~string((string *)local_50);
  return this_local._7_1_;
}

Assistant:

bool ConsumeField(Message* message) {
    const Reflection* reflection = message->GetReflection();
    const Descriptor* descriptor = message->GetDescriptor();

    std::string field_name;
    bool reserved_field = false;
    const FieldDescriptor* field = nullptr;
    int start_line = tokenizer_.current().line;
    int start_column = tokenizer_.current().column;

    auto skip_parsing = [&](bool result) {
      // For historical reasons, fields may optionally be separated by commas or
      // semicolons.
      TryConsume(";") || TryConsume(",");

      // If a parse info tree exists, add the location for the parsed
      // field.
      if (parse_info_tree_ != nullptr) {
        int end_line = tokenizer_.previous().line;
        int end_column = tokenizer_.previous().end_column;

        RecordLocation(
            parse_info_tree_, field,
            ParseLocationRange(ParseLocation(start_line, start_column),
                               ParseLocation(end_line, end_column)));
      }

      return result;
    };

    const FieldDescriptor* any_type_url_field;
    const FieldDescriptor* any_value_field;
    if (internal::GetAnyFieldDescriptors(*message, &any_type_url_field,
                                         &any_value_field) &&
        TryConsume("[")) {
      std::string full_type_name, prefix;
      DO(ConsumeAnyTypeUrl(&full_type_name, &prefix));
      std::string prefix_and_full_type_name =
          absl::StrCat(prefix, full_type_name);
      DO(ConsumeBeforeWhitespace("]"));
      TryConsumeWhitespace();
      // ':' is optional between message labels and values.
      if (TryConsumeBeforeWhitespace(":")) {
        TryConsumeWhitespace();
      }
      std::string serialized_value;
      const Descriptor* value_descriptor =
          finder_ ? finder_->FindAnyType(*message, prefix, full_type_name)
                  : DefaultFinderFindAnyType(*message, prefix, full_type_name);
      if (value_descriptor == nullptr) {
        ReportError(absl::StrCat("Could not find type \"",
                                 prefix_and_full_type_name,
                                 "\" stored in google.protobuf.Any."));
        return false;
      }
      DO(ConsumeAnyValue(value_descriptor, &serialized_value));
      if (singular_overwrite_policy_ == FORBID_SINGULAR_OVERWRITES) {
        // Fail if any_type_url_field has already been specified.
        if ((!any_type_url_field->is_repeated() &&
             reflection->HasField(*message, any_type_url_field)) ||
            (!any_value_field->is_repeated() &&
             reflection->HasField(*message, any_value_field))) {
          ReportError("Non-repeated Any specified multiple times.");
          return false;
        }
      }
      reflection->SetString(message, any_type_url_field,
                            std::move(prefix_and_full_type_name));
      reflection->SetString(message, any_value_field,
                            std::move(serialized_value));
      return skip_parsing(true);
    }
    if (TryConsume("[")) {
      // Extension.
      DO(ConsumeFullTypeName(&field_name));
      DO(ConsumeBeforeWhitespace("]"));
      TryConsumeWhitespace();

      field = finder_ ? finder_->FindExtension(message, field_name)
                      : DefaultFinderFindExtension(message, field_name);

      if (field == nullptr) {
        if (!allow_unknown_field_ && !allow_unknown_extension_) {
          ReportError(absl::StrCat("Extension \"", field_name,
                                   "\" is not defined or "
                                   "is not an extension of \"",
                                   descriptor->full_name(), "\"."));
          return false;
        } else {
          ReportWarning(absl::StrCat(
              "Ignoring extension \"", field_name,
              "\" which is not defined or is not an extension of \"",
              descriptor->full_name(), "\"."));
        }
      }
    } else {
      DO(ConsumeIdentifierBeforeWhitespace(&field_name));
      TryConsumeWhitespace();

      int32_t field_number;
      if (allow_field_number_ && absl::SimpleAtoi(field_name, &field_number)) {
        if (descriptor->IsExtensionNumber(field_number)) {
          field = finder_
                      ? finder_->FindExtensionByNumber(descriptor, field_number)
                      : DefaultFinderFindExtensionByNumber(descriptor,
                                                           field_number);
        } else if (descriptor->IsReservedNumber(field_number)) {
          reserved_field = true;
        } else {
          field = descriptor->FindFieldByNumber(field_number);
        }
      } else {
        field = descriptor->FindFieldByName(field_name);
        // Group-like delimited fields will accept both the capitalized type
        // names as well.
        if (field == nullptr) {
          std::string lower_field_name = field_name;
          absl::AsciiStrToLower(&lower_field_name);
          field = descriptor->FindFieldByName(lower_field_name);
          // If the case-insensitive match worked but the field is NOT a group,
          if (field != nullptr && !internal::cpp::IsGroupLike(*field)) {
            field = nullptr;
          }
          if (field != nullptr && field->message_type()->name() != field_name) {
            field = nullptr;
          }
        }

        if (field == nullptr && allow_case_insensitive_field_) {
          std::string lower_field_name = field_name;
          absl::AsciiStrToLower(&lower_field_name);
          field = descriptor->FindFieldByLowercaseName(lower_field_name);
        }

        if (field == nullptr) {
          reserved_field = descriptor->IsReservedName(field_name);
        }
      }
      if (field == nullptr && !reserved_field) {
        if (!allow_unknown_field_) {
          ReportError(absl::StrCat("Message type \"", descriptor->full_name(),
                                   "\" has no field named \"", field_name,
                                   "\"."));
          return false;
        } else {
          ReportWarning(absl::StrCat("Message type \"", descriptor->full_name(),
                                     "\" has no field named \"", field_name,
                                     "\"."));
        }
      }
    }

    // Skips unknown or reserved fields.
    if (field == nullptr) {
      ABSL_CHECK(allow_unknown_field_ || allow_unknown_extension_ ||
                 reserved_field);

      // Try to guess the type of this field.
      // If this field is not a message, there should be a ":" between the
      // field name and the field value and also the field value should not
      // start with "{" or "<" which indicates the beginning of a message body.
      // If there is no ":" or there is a "{" or "<" after ":", this field has
      // to be a message or the input is ill-formed.
      if (TryConsumeBeforeWhitespace(":")) {
        TryConsumeWhitespace();
        if (!LookingAt("{") && !LookingAt("<")) {
          return skip_parsing(SkipFieldValue());
        }
      }
      return skip_parsing(SkipFieldMessage());
    }

    if (field->options().deprecated()) {
      ReportWarning(absl::StrCat("text format contains deprecated field \"",
                                 field_name, "\""));
    }

    if (singular_overwrite_policy_ == FORBID_SINGULAR_OVERWRITES) {
      // Fail if the field is not repeated and it has already been specified.
      if (!field->is_repeated() && reflection->HasField(*message, field)) {
        ReportError(absl::StrCat("Non-repeated field \"", field_name,
                                 "\" is specified multiple times."));
        return false;
      }
      // Fail if the field is a member of a oneof and another member has already
      // been specified.
      const OneofDescriptor* oneof = field->containing_oneof();
      if (oneof != nullptr && reflection->HasOneof(*message, oneof)) {
        const FieldDescriptor* other_field =
            reflection->GetOneofFieldDescriptor(*message, oneof);
        ReportError(absl::StrCat("Field \"", field_name,
                                 "\" is specified along with "
                                 "field \"",
                                 other_field->name(),
                                 "\", another member "
                                 "of oneof \"",
                                 oneof->name(), "\"."));
        return false;
      }
    }

    // Perform special handling for embedded message types.
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      // ':' is optional here.
      bool consumed_semicolon = TryConsumeBeforeWhitespace(":");
      if (consumed_semicolon) {
        TryConsumeWhitespace();
      }
      if (consumed_semicolon && field->options().weak() &&
          LookingAtType(io::Tokenizer::TYPE_STRING)) {
        // we are getting a bytes string for a weak field.
        std::string tmp;
        DO(ConsumeString(&tmp));
        MessageFactory* factory =
            finder_ ? finder_->FindExtensionFactory(field) : nullptr;
        reflection->MutableMessage(message, field, factory)
            ->ParseFromString(tmp);
        return skip_parsing(true);
      }
    } else {
      // ':' is required here.
      DO(ConsumeBeforeWhitespace(":"));
      TryConsumeWhitespace();
    }

    if (field->is_repeated() && TryConsume("[")) {
      // Short repeated format, e.g.  "foo: [1, 2, 3]".
      if (!TryConsume("]")) {
        // "foo: []" is treated as empty.
        while (true) {
          if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
            // Perform special handling for embedded message types.
            DO(ConsumeFieldMessage(message, reflection, field));
          } else {
            DO(ConsumeFieldValue(message, reflection, field));
          }
          if (TryConsume("]")) {
            break;
          }
          DO(Consume(","));
        }
      }
    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      DO(ConsumeFieldMessage(message, reflection, field));
    } else {
      DO(ConsumeFieldValue(message, reflection, field));
    }

    return skip_parsing(true);
  }